

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_shapes.cxx
# Opt level: O0

void __thiscall xray_re::xr_shape_object::load(xr_shape_object *this,xr_reader *r)

{
  xr_reader *pxVar1;
  uint32_t uVar2;
  size_t sVar3;
  unsigned_short local_1a;
  xr_reader *pxStack_18;
  uint16_t version;
  xr_reader *r_local;
  xr_shape_object *this_local;
  
  pxStack_18 = r;
  r_local = (xr_reader *)this;
  sVar3 = xr_reader::r_chunk<unsigned_short>(r,0,&local_1a);
  if (sVar3 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_shapes.cxx"
                  ,0x1a,"virtual void xray_re::xr_shape_object::load(xr_reader &)");
  }
  if (local_1a == 1) {
    xr_custom_object::load(&this->super_xr_custom_object,pxStack_18);
    sVar3 = xr_reader::find_chunk(pxStack_18,1);
    pxVar1 = pxStack_18;
    if (sVar3 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_shapes.cxx"
                    ,0x1e,"virtual void xray_re::xr_shape_object::load(xr_reader &)");
    }
    uVar2 = xr_reader::r_u32(pxStack_18);
    xr_reader::r_seq<std::vector<xray_re::shape_def,std::allocator<xray_re::shape_def>>,read_shape>
              (pxVar1,uVar2,&this->m_shapes);
    xr_reader::debug_find_chunk(pxStack_18);
    return;
  }
  __assert_fail("version == SHAPE_VERSION",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_shapes.cxx"
                ,0x1b,"virtual void xray_re::xr_shape_object::load(xr_reader &)");
}

Assistant:

void xr_shape_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(SHAPE_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == SHAPE_VERSION);
	xr_custom_object::load(r);
	if (!r.find_chunk(SHAPE_CHUNK_SHAPES))
		xr_not_expected();
	r.r_seq(r.r_u32(), m_shapes, read_shape());
	r.debug_find_chunk();
}